

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O2

FMStructDescList combineCpDpFormats(FMStructDescList top,FMStructDescList cp,FMStructDescList dp)

{
  char **ppcVar1;
  void *__ptr;
  FMStructDescList p_Var2;
  char *pcVar3;
  undefined8 uVar4;
  int repl_size;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  int repl_size_00;
  long lVar8;
  uint uVar9;
  long lVar10;
  bool bVar11;
  
  __ptr = (void *)FMcopy_struct_list();
  uVar5 = 0xffffffffffffffff;
  do {
    uVar9 = (int)uVar5 + 1;
    uVar5 = (ulong)uVar9;
    ppcVar1 = &top->format_name;
    top = top + 1;
  } while (*ppcVar1 != (char *)0x0);
  lVar7 = 0;
  for (p_Var2 = cp; (cp != (FMStructDescList)0x0 && (p_Var2->format_name != (char *)0x0));
      p_Var2 = p_Var2 + 1) {
    lVar7 = lVar7 + 1;
    uVar5 = (ulong)((int)uVar5 + 1);
  }
  lVar8 = 0;
  uVar6 = uVar5;
  for (p_Var2 = dp; (dp != (FMStructDescList)0x0 && (p_Var2->format_name != (char *)0x0));
      p_Var2 = p_Var2 + 1) {
    lVar8 = lVar8 + 1;
    uVar6 = (ulong)((int)uVar6 + 1);
  }
  p_Var2 = (FMStructDescList)realloc(__ptr,(ulong)((int)uVar6 + 1) << 5);
  lVar10 = 0x10;
  while (bVar11 = lVar7 != 0, lVar7 = lVar7 + -1, bVar11) {
    pcVar3 = strdup(*(char **)((long)cp + lVar10 + -0x10));
    *(char **)((long)p_Var2 + lVar10 + (ulong)uVar9 * 0x20 + -0x10) = pcVar3;
    uVar4 = copy_field_list(*(undefined8 *)((long)cp + lVar10 + -8));
    *(undefined8 *)((long)p_Var2 + lVar10 + (ulong)uVar9 * 0x20 + -8) = uVar4;
    *(undefined4 *)((long)&p_Var2[uVar9].format_name + lVar10) =
         *(undefined4 *)((long)&cp->format_name + lVar10);
    *(undefined8 *)((long)&p_Var2[uVar9].field_list + lVar10) = 0;
    lVar10 = lVar10 + 0x20;
  }
  lVar7 = 0x10;
  while (bVar11 = lVar8 != 0, lVar8 = lVar8 + -1, bVar11) {
    pcVar3 = strdup(*(char **)((long)dp + lVar7 + -0x10));
    *(char **)((long)p_Var2 + lVar7 + uVar5 * 0x20 + -0x10) = pcVar3;
    uVar4 = copy_field_list(*(undefined8 *)((long)dp + lVar7 + -8));
    *(undefined8 *)((long)p_Var2 + lVar7 + uVar5 * 0x20 + -8) = uVar4;
    *(undefined4 *)((long)&p_Var2[uVar5].format_name + lVar7) =
         *(undefined4 *)((long)&dp->format_name + lVar7);
    *(undefined8 *)((long)&p_Var2[uVar5].field_list + lVar7) = 0;
    lVar7 = lVar7 + 0x20;
  }
  p_Var2[uVar6].opt_info = (FMOptInfo *)0x0;
  p_Var2[uVar6].struct_size = 0;
  repl_size_00 = 0;
  p_Var2[uVar6].format_name = (char *)0x0;
  p_Var2[uVar6].field_list = (FMFieldList)0x0;
  if (cp == (FMStructDescList)0x0) {
    pcVar3 = (char *)0x0;
    repl_size = 0;
  }
  else {
    pcVar3 = cp->format_name;
    repl_size = cp->struct_size;
  }
  replaceFormatNameInFieldList(p_Var2,"CP_STRUCT",pcVar3,repl_size);
  if (dp == (FMStructDescList)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = dp->format_name;
    repl_size_00 = dp->struct_size;
  }
  replaceFormatNameInFieldList(p_Var2,"DP_STRUCT",pcVar3,repl_size_00);
  return p_Var2;
}

Assistant:

static FMStructDescList combineCpDpFormats(FMStructDescList top, FMStructDescList cp,
                                           FMStructDescList dp)
{
    int i = 0, topCount = 0, cpCount = 0, dpCount = 0;
    FMStructDescList CombinedFormats = FMcopy_struct_list(top);

    i = 0;
    while (top[i++].format_name)
        topCount++;

    i = 0;
    while (cp && cp[i++].format_name)
        cpCount++;

    i = 0;
    while (dp && dp[i++].format_name)
        dpCount++;

    CombinedFormats =
        realloc(CombinedFormats, sizeof(CombinedFormats[0]) * (topCount + cpCount + dpCount + 1));
    for (i = 0; i < cpCount; i++)
    {
        CombinedFormats[topCount + i].format_name = strdup(cp[i].format_name);
        CombinedFormats[topCount + i].field_list = copy_field_list(cp[i].field_list);
        CombinedFormats[topCount + i].struct_size = cp[i].struct_size;
        CombinedFormats[topCount + i].opt_info = NULL;
    }

    for (i = 0; i < dpCount; i++)
    {
        CombinedFormats[topCount + cpCount + i].format_name = strdup(dp[i].format_name);
        CombinedFormats[topCount + cpCount + i].field_list = copy_field_list(dp[i].field_list);
        CombinedFormats[topCount + cpCount + i].struct_size = dp[i].struct_size;
        CombinedFormats[topCount + cpCount + i].opt_info = NULL;
    }
    CombinedFormats[topCount + cpCount + dpCount].format_name = NULL;
    CombinedFormats[topCount + cpCount + dpCount].field_list = NULL;
    CombinedFormats[topCount + cpCount + dpCount].struct_size = 0;
    CombinedFormats[topCount + cpCount + dpCount].opt_info = NULL;

    replaceFormatNameInFieldList(CombinedFormats, "CP_STRUCT", cp ? cp[0].format_name : NULL,
                                 cp ? cp[0].struct_size : 0);
    replaceFormatNameInFieldList(CombinedFormats, "DP_STRUCT", dp ? dp[0].format_name : NULL,
                                 dp ? dp[0].struct_size : 0);
    return CombinedFormats;
}